

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

void * __thiscall
cookmem::MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::allocate
          (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this,size_type userSize)

{
  BinIndexType BVar1;
  uint uVar2;
  BinIndexType x;
  uint uVar3;
  size_t requestSize;
  MemChunk *pMVar4;
  size_type sVar5;
  size_type sVar6;
  Exception *pEVar7;
  void *pvVar8;
  size_type local_80;
  MemChunk *local_70;
  MemChunk *chunk;
  uint J;
  BinIndexType leastbit;
  BinIndexType leftbits;
  BinIndexType i;
  MemChunk *chunk_2;
  MemChunk *chunk_1;
  BinIndexType smallBits;
  BinIndexType binIndex;
  size_type allocSize;
  size_type chunkSize;
  size_type userSize_local;
  MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  requestSize = getMinAllocSize(this,userSize);
  if (requestSize < 0xe1) {
    if (requestSize < 0x10) {
      local_80 = 0x20;
    }
    else {
      local_80 = calcChunkSize(requestSize);
    }
    allocSize = local_80;
    BVar1 = getSmallBinIndex(local_80);
    uVar2 = this->m_smallMap >> ((byte)BVar1 & 0x1f);
    if ((uVar2 & 3) != 0) {
      BVar1 = ((uVar2 ^ 0xffffffff) & 1) + BVar1;
      pMVar4 = removeSmallChunkList(this,BVar1);
      if (pMVar4 != (MemChunk *)0x0) {
        sVar5 = MemChunk::getChunkSize(pMVar4);
        sVar6 = getSmallBinSize(BVar1);
        if (sVar5 == sVar6) {
          setUsed(this,pMVar4,userSize);
          pvVar8 = getUserPointer(this,pMVar4,userSize);
          return pvVar8;
        }
      }
      pEVar7 = (Exception *)__cxa_allocate_exception(0x10);
      Exception::Exception(pEVar7,MEM_ERROR_ASSERT,"assertion failure.");
      __cxa_throw(pEVar7,&Exception::typeinfo,0);
    }
    if (uVar2 != 0) {
      x = idx2bit(BVar1);
      uVar3 = left_bits<unsigned_int>(x);
      uVar2 = least_bit<unsigned_int>(uVar2 << ((byte)BVar1 & 0x1f) & uVar3);
      BVar1 = 0;
      for (; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
        BVar1 = BVar1 + 1;
      }
      pMVar4 = removeSmallChunkList(this,BVar1);
      if (pMVar4 != (MemChunk *)0x0) {
        sVar5 = MemChunk::getChunkSize(pMVar4);
        sVar6 = getSmallBinSize(BVar1);
        if (sVar5 == sVar6) {
          pMVar4 = splitChunk(this,pMVar4,local_80);
          setUsed(this,pMVar4,userSize);
          pvVar8 = getUserPointer(this,pMVar4,userSize);
          return pvVar8;
        }
      }
      pEVar7 = (Exception *)__cxa_allocate_exception(0x10);
      Exception::Exception(pEVar7,MEM_ERROR_ASSERT,"assertion failure.");
      __cxa_throw(pEVar7,&Exception::typeinfo,0);
    }
  }
  else {
    if (0xffffffffffffff7f < requestSize) {
      NoActionMemLogger::logAllocation(this->m_logger,(void *)0x0,userSize);
      return (void *)0x0;
    }
    allocSize = calcChunkSize(requestSize);
  }
  if (this->m_treeMap == 0) {
    local_70 = (MemChunk *)0x0;
  }
  else {
    local_70 = treeMalloc(this,allocSize);
  }
  if ((local_70 == (MemChunk *)0x0) &&
     (local_70 = arenaAlloc(this,allocSize), local_70 == (MemChunk *)0x0)) {
    NoActionMemLogger::logAllocation(this->m_logger,(void *)0x0,userSize);
    this_local = (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)0x0;
  }
  else {
    setUsed(this,local_70,userSize);
    this_local = (MemPool<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)
                 getUserPointer(this,local_70,userSize);
  }
  return this_local;
}

Assistant:

T*
    allocate (size_type userSize)
    {
        size_type  chunkSize;

        size_type allocSize = getMinAllocSize (userSize);

        if (allocSize < MIN_LARGE_REQUEST)
        {
            BinIndexType binIndex;
            BinIndexType smallBits;
            chunkSize = (allocSize < MIN_REQUEST) ? MIN_CHUNK_SIZE : calcChunkSize (allocSize);
            binIndex = getSmallBinIndex (chunkSize);
            smallBits = m_smallMap >> binIndex;

            /*
             * Check if two smallest chunk lists that can satisfy the request.
             * Note that since the chunk is quite tight, it is not necessary
             * to split the chunk since there will not be enough rooms.
             */
            if ((smallBits & 0x3U) != 0)
            {
                MemChunk* chunk;
                binIndex += ~smallBits & 1; /* Uses next bin if idx empty */

                chunk = removeSmallChunkList (binIndex);
                COOKMEM_ASSERT(chunk != nullptr && chunk->getChunkSize() == getSmallBinSize (binIndex));

                setUsed (chunk, userSize);

                return getUserPointer (chunk, userSize);
            }
            else
            {
                if (smallBits != 0)
                {
                    /* Use chunk in next nonempty smallbin */
                    MemChunk* chunk;
                    BinIndexType i;
                    BinIndexType leftbits = (smallBits << binIndex) & left_bits(idx2bit(binIndex));
                    BinIndexType leastbit = least_bit(leftbits);
                    cookmem_bit2treeIndex(leastbit, i);

                    chunk = removeSmallChunkList(i);
                    COOKMEM_ASSERT(chunk != nullptr && chunk->getChunkSize() == getSmallBinSize(i));

                    chunk = splitChunk (chunk, chunkSize);

                    setUsed (chunk, userSize);

                    return getUserPointer (chunk, userSize);
                }
            }
        }
        else if (allocSize >= MAX_REQUEST)
        {
            // The request size is too big.
            m_logger.logAllocation (nullptr, userSize);
            return nullptr;
        }
        else
        {
            chunkSize = calcChunkSize (allocSize);
        }

        MemChunk* chunk;

        /*
         * Check if we have enough space in existing chunks.
         */
        if (m_treeMap != 0)
        {
            chunk = treeMalloc (chunkSize);
        }
        else
        {
            chunk = nullptr;
        }

        /*
         * At this point, we have to allocate memory from arena.
         */
        if (chunk == nullptr)
        {
            chunk = arenaAlloc (chunkSize);

            if (chunk == nullptr)
            {
                m_logger.logAllocation (nullptr, userSize);
                return nullptr;
            }
        }

        setUsed (chunk, userSize);

        return getUserPointer (chunk, userSize);
    }